

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

ptrdiff_t mp_check_map(char *cur,char *end)

{
  byte bVar1;
  uint32_t hsize;
  uint8_t c;
  char *end_local;
  char *cur_local;
  byte local_9;
  
  end_local = cur;
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                  0x7e4,"ptrdiff_t mp_check_map(const char *, const char *)");
  }
  local_9 = *cur;
  if (mp_type_hint[local_9] == MP_MAP) {
    bVar1 = mp_load_u8(&end_local);
    if ((bVar1 & 0xf0) == 0x80) {
      cur_local = end_local + -(long)end;
    }
    else {
      if ((bVar1 < 0xde) || (0xdf < bVar1)) {
        __assert_fail("c >= 0xde && c <= 0xdf",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                      ,0x7ea,"ptrdiff_t mp_check_map(const char *, const char *)");
      }
      cur_local = (char *)((ulong)(uint)(2 << (bVar1 & 1)) - ((long)end - (long)end_local));
    }
    return (ptrdiff_t)cur_local;
  }
  __assert_fail("mp_typeof(*cur) == MP_MAP",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x7e5,"ptrdiff_t mp_check_map(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_map(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_MAP);
	uint8_t c = mp_load_u8(&cur);
	if (mp_likely((c & ~0xfU) == 0x80))
		return cur - end;

	assert(c >= 0xde && c <= 0xdf); /* must be checked above by mp_typeof */
	uint32_t hsize = 2U << (c & 0x1); /* 0xde->2, 0xdf->4 */
	return hsize - (end - cur);
}